

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O3

Maybe<kj::Own<const_kj::File>_> __thiscall
kj::anon_unknown_8::DiskDirectory::tryOpenFile(DiskDirectory *this,PathPtr path,WriteMode mode)

{
  undefined4 in_register_0000000c;
  File *pFVar1;
  File *extraout_RDX;
  WriteMode in_R8D;
  PathPtr path_00;
  Maybe<kj::Own<kj::File>_> MVar2;
  Maybe<kj::Own<const_kj::File>_> MVar3;
  Maybe<kj::AutoCloseFd> local_34;
  _func_int **local_28;
  AutoCloseFd AStack_20;
  
  path_00.parts.size_._4_4_ = in_register_0000000c;
  path_00.parts.size_._0_4_ = mode;
  path_00.parts.ptr = (String *)path.parts.size_;
  DiskHandle::tryOpenFileInternal
            (&local_34,(DiskHandle *)&((path.parts.ptr)->content).size_,path_00,in_R8D,false);
  MVar2 = Maybe<kj::AutoCloseFd>::map<kj::Own<kj::File>_(&)(kj::AutoCloseFd)>
                    ((Maybe<kj::AutoCloseFd> *)&local_28,
                     (_func_Own<kj::File>_AutoCloseFd *)&local_34);
  pFVar1 = MVar2.ptr.ptr;
  (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = local_28;
  (this->super_DiskHandle).fd = AStack_20;
  AStack_20.fd = 0;
  AStack_20.unwindDetector.uncaughtCount = 0;
  if (local_34.ptr.isSet == true) {
    AutoCloseFd::~AutoCloseFd(&local_34.ptr.field_1.value);
    pFVar1 = extraout_RDX;
  }
  MVar3.ptr.ptr = pFVar1;
  MVar3.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<const_kj::File>_>)MVar3.ptr;
}

Assistant:

Maybe<Own<const File>> tryOpenFile(PathPtr path, WriteMode mode) const override {
    return DiskHandle::tryOpenFile(path, mode);
  }